

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<unsigned_char> __thiscall wasm::WATParser::Lexer::takeU<unsigned_char>(Lexer *this)

{
  pointer pAVar1;
  ushort uVar2;
  string_view in;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,in);
  if ((result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
       ._M_payload.
       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._M_payload
       ._M_value.sign._0_1_ == '\x01') &&
     ((ulong)result.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
             _M_payload._8_8_ < (char *)0x100 &&
      result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.n._0_4_ == 0)) {
    this->pos = this->pos + (long)local_40;
    pAVar1 = (this->annotations).
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
      (this->annotations).
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar1;
    }
    skipSpace(this);
    uVar2 = 0x100;
  }
  else {
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.super_LexResult.span._M_str = (char *)0x0;
    uVar2 = 0;
  }
  return (_Optional_base<unsigned_char,_true,_true>)
         (uVar2 | (ushort)result.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.super_LexResult.span._M_str);
}

Assistant:

std::optional<T> Lexer::takeU() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next()); result && result->isUnsigned<T>()) {
    pos += result->span.size();
    advance();
    return T(result->n);
  }
  // TODO: Add error production for unsigned overflow.
  return std::nullopt;
}